

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NEST.cpp
# Opt level: O0

double __thiscall NEST::NESTcalc::CalcElectronLET(NESTcalc *this,double E,int Z,bool CSDA)

{
  bool bVar1;
  uint uVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  double dVar6;
  double dVar7;
  double dVar8;
  double dVar9;
  double dVar10;
  double dVar11;
  __type _Var12;
  __type _Var13;
  __type _Var14;
  __type _Var15;
  __type _Var16;
  __type _Var17;
  undefined8 local_30;
  double LET;
  bool CSDA_local;
  int Z_local;
  double E_local;
  NESTcalc *this_local;
  
  if (CSDA) {
    bVar1 = ValidityTests::nearlyEqual(54.0,54.0,1e-09);
    if (bVar1) {
      if (E < 1.0) {
        if ((E <= 0.0) || (1.0 <= E)) {
          local_30 = (NESTcalc *)0x0;
        }
        else {
          _Var13 = std::pow<double,int>(E,2);
          _Var14 = std::pow<double,int>(E,3);
          _Var15 = std::pow<double,int>(E,4);
          _Var16 = std::pow<double,int>(E,5);
          _Var17 = std::pow<double,int>(E,6);
          _Var12 = std::pow<double,int>(E,7);
          local_30 = (NESTcalc *)
                     (_Var12 * 7483.8 +
                     _Var17 * -28659.0 +
                     _Var16 * 44553.0 +
                     _Var15 * -36394.0 + _Var14 * 17079.0 + _Var13 * -4828.0 + E * 815.98 + 6.9463);
        }
      }
      else {
        dVar3 = log10(E);
        dVar4 = log10(E);
        _Var13 = std::pow<double,int>(dVar4,2);
        dVar4 = log10(E);
        _Var14 = std::pow<double,int>(dVar4,3);
        dVar4 = log10(E);
        _Var15 = std::pow<double,int>(dVar4,4);
        dVar4 = log10(E);
        _Var16 = std::pow<double,int>(dVar4,5);
        dVar4 = log10(E);
        _Var17 = std::pow<double,int>(dVar4,6);
        dVar4 = log10(E);
        _Var12 = std::pow<double,int>(dVar4,7);
        local_30 = (NESTcalc *)
                   (_Var12 * 0.0065108 +
                   _Var17 * -0.12619 +
                   _Var16 * 0.96788 +
                   _Var15 * -3.3469 + _Var14 * 2.3101 + _Var13 * 19.749 + dVar3 * -61.183 + 58.482);
      }
    }
    else if (E < 1.0) {
      if ((E <= 0.0) || (1.0 <= E)) {
        local_30 = (NESTcalc *)0x0;
      }
      else {
        local_30 = (NESTcalc *)0x4059000000000000;
      }
    }
    else {
      dVar3 = log10(E);
      dVar4 = log10(E);
      _Var13 = std::pow<double,int>(dVar4,2);
      dVar4 = log10(E);
      _Var14 = std::pow<double,int>(dVar4,3);
      dVar4 = log10(E);
      _Var15 = std::pow<double,int>(dVar4,4);
      dVar4 = log10(E);
      _Var16 = std::pow<double,int>(dVar4,5);
      dVar4 = log10(E);
      _Var17 = std::pow<double,int>(dVar4,6);
      local_30 = (NESTcalc *)
                 (_Var17 * 0.031563 +
                 _Var16 * -0.69334 +
                 _Var15 * 6.5069 + _Var14 * -33.405 + _Var13 * 99.361 + dVar3 * -162.97 + 116.7);
    }
    this_local = local_30;
  }
  else {
    bVar1 = ValidityTests::nearlyEqual(54.0,54.0,1e-09);
    if (bVar1) {
      dVar3 = log10(E);
      dVar4 = log10(E);
      dVar4 = pow(dVar4,2.0);
      dVar5 = log10(E);
      dVar5 = pow(dVar5,3.0);
      dVar6 = log10(E);
      dVar6 = pow(dVar6,4.0);
      dVar7 = log10(E);
      dVar7 = pow(dVar7,5.0);
      dVar8 = log10(E);
      dVar8 = pow(dVar8,6.0);
      dVar9 = log10(E);
      dVar9 = pow(dVar9,7.0);
      dVar10 = log10(E);
      dVar10 = pow(dVar10,8.0);
      dVar11 = log10(E);
      dVar11 = pow(dVar11,9.0);
      local_30 = (NESTcalc *)
                 (dVar11 * 0.00079395 +
                 dVar10 * -0.011957 +
                 dVar9 * 0.077169 +
                 dVar8 * -0.28706 +
                 dVar7 * 0.69658 +
                 dVar6 * -1.1539 + dVar5 * 1.3677 + dVar4 * -1.2364 + dVar3 * 0.11493 + 1.4555);
    }
    else {
      dVar3 = log10(E);
      dVar4 = log10(E);
      dVar4 = pow(dVar4,2.0);
      dVar5 = log10(E);
      dVar5 = pow(dVar5,3.0);
      dVar6 = log10(E);
      dVar6 = pow(dVar6,4.0);
      dVar7 = log10(E);
      dVar7 = pow(dVar7,5.0);
      dVar8 = log10(E);
      dVar8 = pow(dVar8,6.0);
      dVar9 = log10(E);
      dVar9 = pow(dVar9,7.0);
      dVar10 = log10(E);
      dVar10 = pow(dVar10,8.0);
      dVar11 = log10(E);
      dVar11 = pow(dVar11,9.0);
      local_30 = (NESTcalc *)
                 (dVar11 * 0.00045633 +
                 dVar10 * -0.0058953 +
                 dVar9 * 0.030441 +
                 dVar8 * -0.084659 +
                 dVar7 * 0.15279 +
                 dVar6 * -0.2051 + dVar5 * 0.25916 + dVar4 * -0.33151 + dVar3 * -0.45086 + 1.8106);
    }
    local_30 = (NESTcalc *)pow(10.0,(double)local_30);
    uVar2 = std::isnan((double)local_30);
    if (((uVar2 & 1) != 0) || ((double)local_30 <= 1.0)) {
      local_30 = (NESTcalc *)0x4059000000000000;
    }
    this_local = local_30;
  }
  return (double)this_local;
}

Assistant:

double NESTcalc::CalcElectronLET(double E, int Z, bool CSDA) {
  double LET;

  if (!CSDA) {  // total stopping power directly from ESTAR (radiative +
                // collision)
    if (ValidityTests::nearlyEqual(ATOM_NUM,
                                   54.))  // loglog poly fit to 1-3e3keV
      LET = 1.4555 + 0.11493 * log10(E) - 1.2364 * pow(log10(E), 2.) +
            1.3677 * pow(log10(E), 3.) - 1.1539 * pow(log10(E), 4.) +
            0.69658 * pow(log10(E), 5.) - 0.28706 * pow(log10(E), 6.) +
            0.077169 * pow(log10(E), 7.) - 0.011957 * pow(log10(E), 8.) +
            0.00079395 * pow(log10(E), 9.);
    else  // ditto(ARGON)
      LET = 1.8106 - 0.45086 * log10(E) - .33151 * pow(log10(E), 2.) +
            .25916 * pow(log10(E), 3.) - 0.2051 * pow(log10(E), 4.) +
            0.15279 * pow(log10(E), 5.) - .084659 * pow(log10(E), 6.) +
            0.030441 * pow(log10(E), 7.) - .0058953 * pow(log10(E), 8.) +
            0.00045633 * pow(log10(E), 9.);
    LET = pow(10., LET);
    if (std::isnan(LET) || LET <= 1.) LET = 1e2;
    return LET;
  }

  // use a 9th-order polynomial spline to online CSDA data (still NIST's ESTAR)
  if (ValidityTests::nearlyEqual(ATOM_NUM, 54.)) {
    if (E >= 1.)
      LET = 58.482 - 61.183 * log10(E) + 19.749 * pow(log10(E), 2) +
            2.3101 * pow(log10(E), 3) - 3.3469 * pow(log10(E), 4) +
            0.96788 * pow(log10(E), 5) - 0.12619 * pow(log10(E), 6) +
            0.0065108 * pow(log10(E), 7);
    // at energies <1 keV, use a different spline, determined manually by
    // generating sub-keV electrons in Geant4 and looking at their ranges, since
    // ESTAR does not go this low (4.9.4)
    else if (E > 0. && E < 1.) {
      LET = 6.9463 + 815.98 * E - 4828 * pow(E, 2) + 17079 * pow(E, 3) -
            36394 * pow(E, 4) + 44553 * pow(E, 5) - 28659 * pow(E, 6) +
            7483.8 * pow(E, 7);
    } else {
      LET = 0.;
    }
  } else {
    // replace with Justin and Prof. Mooney's work
    if (E >= 1.)
      LET = 116.70 - 162.97 * log10(E) + 99.361 * pow(log10(E), 2) -
            33.405 * pow(log10(E), 3) + 6.5069 * pow(log10(E), 4) -
            0.69334 * pow(log10(E), 5) + .031563 * pow(log10(E), 6);
    else if (E > 0. && E < 1.) {
      LET = 100.;
    } else {
      LET = 0.;
    }
  }

  return LET;
}